

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O3

runtime_type<> * __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::put_transaction<void>::complete_type(put_transaction<void> *this)

{
  uintptr_t uint_pointer;
  
  if ((this->m_put).m_user_storage == (void *)0x0) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0x32f);
  }
  return (runtime_type<> *)((this->m_put).m_control_block + 1);
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *Base::type_after_control(m_put.m_control_block);
            }